

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImSpan<ImGuiTableColumn> *this;
  double dVar1;
  uint uVar2;
  ImGuiWindow *outer_window;
  ImGuiWindow *pIVar3;
  void *pvVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  void *pvVar7;
  bool bVar8;
  int iVar9;
  ImPoolIdx i;
  uint uVar10;
  ImU32 IVar11;
  ImGuiTable *p;
  ImGuiTableTempData *pIVar12;
  float *pfVar13;
  void *ptr;
  ImGuiTableColumn *pIVar14;
  char *pcVar15;
  ImGuiTableColumn *pIVar16;
  ImGuiID id_00;
  ImRect *pIVar17;
  long lVar18;
  int n;
  ulong uVar19;
  ImGuiTableColumn *pIVar20;
  ImGuiTableColumn *pIVar21;
  ImGuiContext *g;
  byte bVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  ImRect IVar27;
  ImGuiTableColumn *local_118;
  int local_dc;
  ImRect outer_rect;
  ImGuiTableTempData local_a8;
  
  pIVar6 = GImGui;
  bVar22 = 0;
  outer_window = GImGui->CurrentWindow;
  outer_window->WriteAccessed = true;
  if (outer_window->SkipItems != false) {
    return false;
  }
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x13e,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0x140,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar5 = GetContentRegionAvail();
  fVar24 = IVar5.y;
  auVar23._8_4_ = extraout_XMM0_Dc;
  auVar23._0_4_ = IVar5.x;
  auVar23._4_4_ = IVar5.y;
  auVar23._12_4_ = extraout_XMM0_Dd;
  if (IVar5.x <= 1.0) {
    auVar23._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar5 = CalcItemSize(*outer_size,auVar23._0_4_,0.0);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar5.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar5.x + outer_rect.Min.x;
  }
  else {
    if (fVar24 <= 1.0) {
      fVar24 = 1.0;
    }
    IVar5 = CalcItemSize(*outer_size,auVar23._0_4_,fVar24);
    outer_rect.Min = (outer_window->DC).CursorPos;
    outer_rect.Max.y = IVar5.y + outer_rect.Min.y;
    outer_rect.Max.x = IVar5.x + outer_rect.Min.x;
    bVar8 = IsClippedEx(&outer_rect,0);
    if (bVar8) {
      ItemSize(&outer_rect,-1.0);
      return false;
    }
  }
  p = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar6->Tables,id);
  if (p->LastFrameActive == pIVar6->FrameCount) {
    iVar9 = (int)p->InstanceCurrent;
    local_dc = iVar9 + 1;
    id_00 = iVar9 + id + 1;
    uVar2 = p->Flags;
    if (iVar9 < 0) {
      bVar8 = false;
    }
    else {
      bVar8 = true;
      if (p->ColumnsCount != columns_count) {
        __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                      ,0x153,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
  }
  else {
    uVar2 = p->Flags;
    bVar8 = false;
    local_dc = 0;
    id_00 = id;
  }
  i = ImPool<ImGuiTable>::GetIndex(&pIVar6->Tables,p);
  iVar9 = pIVar6->TablesTempDataStacked;
  pIVar6->TablesTempDataStacked = iVar9 + 1;
  if ((pIVar6->TablesTempData).Size <= iVar9) {
    local_a8.UserOuterSize.x = 0.0;
    local_a8.UserOuterSize.y = 0.0;
    local_a8.HostBackupColumnsOffset.x = 0.0;
    local_a8.HostBackupItemWidth = 0.0;
    local_a8.HostBackupItemWidthStackSize = 0;
    local_a8._108_4_ = 0;
    local_a8.HostBackupCurrLineSize.x = 0.0;
    local_a8.HostBackupCurrLineSize.y = 0.0;
    local_a8.HostBackupCursorMaxPos.x = 0.0;
    local_a8.HostBackupCursorMaxPos.y = 0.0;
    local_a8.HostBackupParentWorkRect.Max.x = 0.0;
    local_a8.HostBackupParentWorkRect.Max.y = 0.0;
    local_a8.HostBackupPrevLineSize.x = 0.0;
    local_a8.HostBackupPrevLineSize.y = 0.0;
    local_a8.HostBackupWorkRect.Max.x = 0.0;
    local_a8.HostBackupWorkRect.Max.y = 0.0;
    local_a8.HostBackupParentWorkRect.Min.x._0_3_ = 0;
    local_a8.HostBackupParentWorkRect.Min._3_5_ = 0;
    local_a8.DrawSplitter._Channels.Data = (ImDrawChannel *)0x0;
    local_a8.HostBackupWorkRect.Min.x._0_3_ = 0;
    local_a8.HostBackupWorkRect.Min._3_5_ = 0;
    local_a8.DrawSplitter._Current = 0;
    local_a8.DrawSplitter._Count = 0;
    local_a8.DrawSplitter._Channels.Size = 0;
    local_a8.DrawSplitter._Channels.Capacity = 0;
    local_a8.TableIndex = 0;
    local_a8.LastTimeActive = -1.0;
    ImVector<ImGuiTableTempData>::resize(&pIVar6->TablesTempData,iVar9 + 1,&local_a8);
    ImDrawListSplitter::~ImDrawListSplitter(&local_a8.DrawSplitter);
    iVar9 = pIVar6->TablesTempDataStacked + -1;
  }
  pIVar12 = ImVector<ImGuiTableTempData>::operator[](&pIVar6->TablesTempData,iVar9);
  p->TempData = pIVar12;
  pIVar12->TableIndex = i;
  p->DrawSplitter = &pIVar12->DrawSplitter;
  (pIVar12->DrawSplitter)._Current = 0;
  (pIVar12->DrawSplitter)._Count = 1;
  p->IsDefaultSizingPolicy = (flags & 0xe000U) == 0;
  uVar10 = TableFixFlags(flags,outer_window);
  p->ID = id;
  p->Flags = uVar10;
  p->InstanceCurrent = (ImS16)local_dc;
  p->LastFrameActive = pIVar6->FrameCount;
  p->InnerWindow = outer_window;
  p->OuterWindow = outer_window;
  p->ColumnsCount = columns_count;
  p->IsLayoutLocked = false;
  p->InnerWidth = inner_width;
  pIVar12->UserOuterSize = *outer_size;
  if ((bVar8) && ((p->InstanceDataExtra).Size < local_dc)) {
    local_a8.TableIndex = 0;
    local_a8.LastTimeActive = 0.0;
    ImVector<ImGuiTableInstanceData>::push_back
              (&p->InstanceDataExtra,(ImGuiTableInstanceData *)&local_a8);
  }
  if ((flags & 0x3000000U) == 0) {
    (p->InnerRect).Min = outer_rect.Min;
    (p->InnerRect).Max = outer_rect.Max;
    (p->OuterRect).Min = outer_rect.Min;
    (p->OuterRect).Max = outer_rect.Max;
    (p->WorkRect).Min = outer_rect.Min;
    (p->WorkRect).Max = outer_rect.Max;
  }
  else {
    fVar24 = inner_width;
    if ((uVar10 & 0x1000000) == 0) {
      fVar24 = 3.4028235e+38;
    }
    local_a8.LastTimeActive = 0.0;
    fVar24 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar24 & -(uint)(0.0 < inner_width));
    if ((((uVar10 & 0x3000000) == 0x1000000) || (fVar24 != 3.4028235e+38)) || (NAN(fVar24))) {
      if ((uVar10 & 0x3000000) == 0x1000000) {
        local_a8.LastTimeActive = 1.1754944e-38;
      }
      local_a8.TableIndex = -(uint)(fVar24 != 3.4028235e+38) & (uint)fVar24;
      SetNextWindowContentSize((ImVec2 *)&local_a8);
    }
    if ((uVar2 & 0x3000000) == 0) {
      local_a8.TableIndex = 0;
      local_a8.LastTimeActive = 0.0;
      SetNextWindowScroll((ImVec2 *)&local_a8);
    }
    local_a8.TableIndex = (int)(outer_rect.Max.x - outer_rect.Min.x);
    local_a8.LastTimeActive = outer_rect.Max.y - outer_rect.Min.y;
    BeginChildEx(name,id_00,(ImVec2 *)&local_a8,false,(uVar10 & 0x1000000) >> 0xd);
    pIVar3 = pIVar6->CurrentWindow;
    p->InnerWindow = pIVar3;
    IVar5 = (pIVar3->WorkRect).Max;
    (p->WorkRect).Min = (pIVar3->WorkRect).Min;
    (p->WorkRect).Max = IVar5;
    IVar27 = ImGuiWindow::Rect(pIVar3);
    p->OuterRect = IVar27;
    pIVar3 = p->InnerWindow;
    IVar5 = (pIVar3->InnerRect).Max;
    (p->InnerRect).Min = (pIVar3->InnerRect).Min;
    (p->InnerRect).Max = IVar5;
    fVar24 = (pIVar3->WindowPadding).x;
    if ((((fVar24 != 0.0) || (NAN(fVar24))) ||
        ((fVar24 = (pIVar3->WindowPadding).y, fVar24 != 0.0 ||
         ((NAN(fVar24) || (pIVar3->WindowBorderSize != 0.0)))))) || (NAN(pIVar3->WindowBorderSize)))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                    ,0x18d,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(id_00);
  pIVar3 = p->InnerWindow;
  p->HostIndentX = (pIVar3->DC).Indent.x;
  IVar5 = (pIVar3->ClipRect).Max;
  (p->HostClipRect).Min = (pIVar3->ClipRect).Min;
  (p->HostClipRect).Max = IVar5;
  p->HostSkipItems = pIVar3->SkipItems;
  IVar5 = (pIVar3->WorkRect).Max;
  (pIVar12->HostBackupWorkRect).Min = (pIVar3->WorkRect).Min;
  (pIVar12->HostBackupWorkRect).Max = IVar5;
  IVar5 = (pIVar3->ParentWorkRect).Max;
  (pIVar12->HostBackupParentWorkRect).Min = (pIVar3->ParentWorkRect).Min;
  (pIVar12->HostBackupParentWorkRect).Max = IVar5;
  (pIVar12->HostBackupColumnsOffset).x = (outer_window->DC).ColumnsOffset.x;
  pIVar12->HostBackupPrevLineSize = (pIVar3->DC).PrevLineSize;
  pIVar12->HostBackupCurrLineSize = (pIVar3->DC).CurrLineSize;
  pIVar12->HostBackupCursorMaxPos = (pIVar3->DC).CursorMaxPos;
  pIVar12->HostBackupItemWidth = (outer_window->DC).ItemWidth;
  pIVar12->HostBackupItemWidthStackSize = (outer_window->DC).ItemWidthStack.Size;
  fVar24 = 0.0;
  fVar26 = 0.0;
  if ((uVar10 >> 9 & 1) != 0) {
    fVar26 = 1.0;
  }
  (pIVar3->DC).CurrLineSize.x = 0.0;
  (pIVar3->DC).CurrLineSize.y = 0.0;
  (pIVar3->DC).PrevLineSize.x = 0.0;
  (pIVar3->DC).PrevLineSize.y = 0.0;
  if ((uVar10 & 0x800200) == 0x200) {
    fVar24 = (pIVar6->Style).CellPadding.x;
LAB_00178b3f:
    fVar25 = 0.0;
  }
  else {
    if ((uVar10 & 0x800200) != 0) goto LAB_00178b3f;
    fVar25 = (pIVar6->Style).CellPadding.x;
  }
  p->CellSpacingX1 = fVar26 + fVar25;
  p->CellSpacingX2 = fVar25;
  p->CellPaddingX = fVar24;
  p->CellPaddingY = (pIVar6->Style).CellPadding.y;
  fVar26 = 0.0;
  fVar25 = 0.0;
  if ((uVar10 >> 10 & 1) != 0) {
    fVar25 = 1.0;
  }
  if ((uVar10 >> 0x16 & 1) == 0 && (uVar10 & 0x200400) != 0) {
    fVar26 = (pIVar6->Style).CellPadding.x;
  }
  p->OuterPaddingX = (fVar25 + fVar26) - fVar24;
  p->CurrentRow = -1;
  p->CurrentColumn = -1;
  p->RowBgColorCounter = 0;
  pIVar17 = &pIVar3->ClipRect;
  if (pIVar3 == outer_window) {
    pIVar17 = &p->WorkRect;
  }
  *(uint *)&p->field_0x98 = (uint)*(ushort *)&p->field_0x98;
  IVar5 = pIVar17->Max;
  (p->InnerClipRect).Min = pIVar17->Min;
  (p->InnerClipRect).Max = IVar5;
  ImRect::ClipWith(&p->InnerClipRect,&p->WorkRect);
  ImRect::ClipWithFull(&p->InnerClipRect,&p->HostClipRect);
  if ((uVar10 >> 0x11 & 1) == 0) {
    fVar24 = (pIVar3->ClipRect).Max.y;
  }
  else {
    fVar24 = (p->InnerClipRect).Max.y;
    fVar26 = (pIVar3->WorkRect).Max.y;
    if (fVar26 <= fVar24) {
      fVar24 = fVar26;
    }
  }
  (p->InnerClipRect).Max.y = fVar24;
  fVar24 = (p->WorkRect).Min.y;
  p->RowPosY2 = fVar24;
  p->RowPosY1 = fVar24;
  p->RowTextBaseline = 0.0;
  p->FreezeRowsRequest = '\0';
  p->FreezeRowsCount = '\0';
  p->FreezeColumnsRequest = '\0';
  p->FreezeColumnsCount = '\0';
  p->IsUnfrozenRows = true;
  p->DeclColumnsCount = '\0';
  IVar11 = GetColorU32(0x2d,1.0);
  p->BorderColorStrong = IVar11;
  IVar11 = GetColorU32(0x2e,1.0);
  p->BorderColorLight = IVar11;
  pIVar6->CurrentTable = p;
  (outer_window->DC).CurrentTableIdx = i;
  if (pIVar3 != outer_window) {
    (pIVar3->DC).CurrentTableIdx = i;
  }
  if (((uVar2 & 2) != 0) && ((uVar10 & 2) == 0)) {
    p->IsResetDisplayOrderRequest = true;
  }
  if ((pIVar6->TablesLastTimeActive).Size <= i) {
    local_a8.TableIndex = -0x40800000;
    ImVector<float>::resize(&pIVar6->TablesLastTimeActive,i + 1,(float *)&local_a8);
  }
  dVar1 = pIVar6->Time;
  pfVar13 = ImVector<float>::operator[](&pIVar6->TablesLastTimeActive,i);
  *pfVar13 = (float)dVar1;
  pIVar12->LastTimeActive = (float)pIVar6->Time;
  p->MemoryCompacted = false;
  pvVar4 = p->RawData;
  local_118 = (p->Columns).Data;
  iVar9 = (int)(((long)(p->Columns).DataEnd - (long)local_118) / 0x68);
  if (iVar9 == columns_count || iVar9 == 0) {
    local_118 = (ImGuiTableColumn *)0x0;
    ptr = (void *)0x0;
    pvVar7 = (void *)0x0;
    if (pvVar4 == (void *)0x0) goto LAB_00178d84;
  }
  else {
    p->RawData = (void *)0x0;
    pvVar7 = pvVar4;
LAB_00178d84:
    ptr = pvVar7;
    TableBeginInitMemory(p,columns_count);
    p->IsSettingsRequestLoad = true;
    p->IsInitializing = true;
  }
  this = &p->Columns;
  if (p->IsResetAllRequest == true) {
    p->IsInitializing = true;
    p->IsResetAllRequest = false;
    p->IsSettingsRequestLoad = false;
    p->IsSettingsDirty = true;
    p->SettingsLoadedFlags = 0;
  }
  else if ((p->IsInitializing & 1U) == 0) goto LAB_00178f10;
  p->SettingsOffset = -1;
  p->IsSortSpecsDirty = true;
  p->InstanceInteracted = -1;
  p->ContextPopupColumn = -1;
  p->ReorderColumn = -1;
  p->HoveredColumnBody = -1;
  p->HoveredColumnBorder = -1;
  p->AutoFitSingleColumn = -1;
  p->ResizedColumn = -1;
  p->LastResizedColumn = -1;
  pIVar16 = local_118;
  for (uVar19 = 0; (uint)columns_count != uVar19; uVar19 = uVar19 + 1) {
    pIVar14 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar19);
    if ((local_118 == (ImGuiTableColumn *)0x0) || ((long)iVar9 <= (long)uVar19)) {
      local_a8.DrawSplitter._Channels.Data = (ImDrawChannel *)0x0;
      local_a8.HostBackupWorkRect.Min.x._0_3_ = 0;
      local_a8.HostBackupWorkRect.Min._3_5_ = 0;
      local_a8.DrawSplitter._Current = 0;
      local_a8.DrawSplitter._Count = 0;
      local_a8.DrawSplitter._Channels.Size = 0;
      local_a8.DrawSplitter._Channels.Capacity = 0;
      local_a8.HostBackupWorkRect.Max.x = 0.0;
      local_a8.TableIndex = 0;
      local_a8.LastTimeActive = 0.0;
      local_a8.UserOuterSize.x = 0.0;
      local_a8.UserOuterSize.y = 0.0;
      local_a8.HostBackupParentWorkRect.Min.x._0_3_ = 0xffffff;
      local_a8.HostBackupWorkRect.Max.y = -NAN;
      pIVar14->Flags = 0;
      pIVar14->WidthGiven = 0.0;
      pIVar14->MinX = 0.0;
      pIVar14->MaxX = 0.0;
      pIVar14->WidthRequest = -1.0;
      pIVar14->StretchWeight = -1.0;
      pIVar14->InitStretchWeightOrWidth = 0.0;
      (pIVar14->ClipRect).Min.x = 0.0;
      *(undefined8 *)&(pIVar14->ClipRect).Min.y = 0;
      (pIVar14->ClipRect).Max.y = 0.0;
      pIVar14->UserID = 0;
      pIVar14->WorkMinX = 0.0;
      pIVar14->WorkMaxX = 0.0;
      pIVar14->ItemWidth = 0.0;
      pIVar14->ContentMaxXFrozen = 0.0;
      pIVar14->ContentMaxXUnfrozen = 0.0;
      pIVar14->ContentMaxXHeadersUsed = 0.0;
      *(undefined8 *)((long)&pIVar14->ContentMaxXUnfrozen + 3) = 0;
      *(undefined8 *)((long)&pIVar14->ContentMaxXHeadersIdeal + 3) = 0xffffffffffffff00;
      pIVar14->IsUserEnabledNextFrame = false;
      pIVar14->IsVisibleX = false;
      pIVar14->IsVisibleY = false;
      pIVar14->IsRequestOutput = false;
      pIVar14->IsSkipItems = false;
      pIVar14->IsPreserveWidthAuto = false;
      pIVar14->NavLayerCurrent = '\0';
      pIVar14->AutoFitQueue = '\0';
      pIVar14->AutoFitQueue = '\0';
      pIVar14->CannotSkipItemsQueue = '\0';
      pIVar14->field_0x65 = 0;
      pIVar14->SortDirectionsAvailList = '\0';
      pIVar14->IsPreserveWidthAuto = true;
      pIVar14->IsUserEnabled = true;
      pIVar14->IsUserEnabledNextFrame = true;
      pIVar14->DrawChannelCurrent = 0xff;
      pIVar14->DrawChannelFrozen = 0xff;
      pIVar14->DrawChannelUnfrozen = 0xff;
      pIVar14->IsEnabled = true;
    }
    else {
      pIVar20 = pIVar16;
      pIVar21 = pIVar14;
      for (lVar18 = 0x67; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(char *)&pIVar21->Flags = (char)pIVar20->Flags;
        pIVar20 = (ImGuiTableColumn *)((long)pIVar20 + (ulong)bVar22 * -2 + 1);
        pIVar21 = (ImGuiTableColumn *)((long)pIVar21 + (ulong)bVar22 * -2 + 1);
      }
    }
    pcVar15 = ImSpan<signed_char>::operator[](&p->DisplayOrderToIndex,(int)uVar19);
    *pcVar15 = (ImGuiTableColumnIdx)uVar19;
    pIVar14->DisplayOrder = (ImGuiTableColumnIdx)uVar19;
    pIVar16 = pIVar16 + 1;
  }
LAB_00178f10:
  if (ptr != (void *)0x0) {
    MemFree(ptr);
  }
  if (p->IsSettingsRequestLoad == true) {
    TableLoadSettings(p);
  }
  fVar24 = pIVar6->FontSize;
  fVar26 = p->RefScale;
  if ((fVar26 != 0.0) || (NAN(fVar26))) {
    if ((fVar26 != fVar24) || (NAN(fVar26) || NAN(fVar24))) {
      for (iVar9 = 0; columns_count != iVar9; iVar9 = iVar9 + 1) {
        pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,iVar9);
        fVar25 = pIVar16->WidthRequest;
        pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,iVar9);
        pIVar16->WidthRequest = fVar25 * (fVar24 / fVar26);
      }
    }
  }
  p->RefScale = fVar24;
  pIVar3->SkipItems = true;
  if (0 < (p->ColumnsNames).Buf.Size) {
    ImVector<char>::resize(&(p->ColumnsNames).Buf,0);
  }
  TableBeginApplyRequests(p);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;
    if (instance_no > 0 && table->InstanceDataExtra.Size < instance_no)
        table->InstanceDataExtra.push_back(ImGuiTableInstanceData());

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}